

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

void UpdatePSBTOutput(SigningProvider *provider,PartiallySignedTransaction *psbt,int index)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CMutableTransaction *tx;
  reference amount;
  reference this;
  long in_FS_OFFSET;
  MutableTransactionSignatureCreator creator;
  SignatureData sigdata;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  tx = (CMutableTransaction *)
       inline_assertion_check<true,std::optional<CMutableTransaction>&>
                 (&psbt->tx,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/psbt.cpp"
                  ,0x154,"UpdatePSBTOutput","psbt.tx");
  amount = std::vector<CTxOut,_std::allocator<CTxOut>_>::at(&tx->vout,(long)index);
  this = std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::at(&psbt->outputs,(long)index);
  sigdata.complete = false;
  sigdata.witness = false;
  p_Var1 = &sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&sigdata.scriptSig,0,0xb8);
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sigdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  sigdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  sigdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sigdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  PSBTOutput::FillSignatureData(this,&sigdata);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (&creator,tx,0,&amount->nValue,1);
  ProduceSignature(provider,&creator.super_BaseSignatureCreator,&amount->scriptPubKey,&sigdata);
  PSBTOutput::FromSignatureData(this,&sigdata);
  SignatureData::~SignatureData(&sigdata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdatePSBTOutput(const SigningProvider& provider, PartiallySignedTransaction& psbt, int index)
{
    CMutableTransaction& tx = *Assert(psbt.tx);
    const CTxOut& out = tx.vout.at(index);
    PSBTOutput& psbt_out = psbt.outputs.at(index);

    // Fill a SignatureData with output info
    SignatureData sigdata;
    psbt_out.FillSignatureData(sigdata);

    // Construct a would-be spend of this output, to update sigdata with.
    // Note that ProduceSignature is used to fill in metadata (not actual signatures),
    // so provider does not need to provide any private keys (it can be a HidingSigningProvider).
    MutableTransactionSignatureCreator creator(tx, /*input_idx=*/0, out.nValue, SIGHASH_ALL);
    ProduceSignature(provider, creator, out.scriptPubKey, sigdata);

    // Put redeem_script, witness_script, key paths, into PSBTOutput.
    psbt_out.FromSignatureData(sigdata);
}